

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O1

int __thiscall
xercesc_4_0::NameDatatypeValidator::compare
          (NameDatatypeValidator *this,XMLCh *lValue,XMLCh *rValue,MemoryManager *param_3)

{
  XMLCh XVar1;
  XMLCh XVar2;
  bool bVar3;
  
  if (lValue == rValue) {
LAB_00304277:
    bVar3 = false;
  }
  else {
    if (rValue != (XMLCh *)0x0 && lValue != (XMLCh *)0x0) {
      do {
        XVar1 = *lValue;
        if (XVar1 == L'\0') goto LAB_0030426e;
        lValue = lValue + 1;
        XVar2 = *rValue;
        rValue = rValue + 1;
      } while (XVar1 == XVar2);
      bVar3 = true;
      goto LAB_00304279;
    }
    if (lValue == (XMLCh *)0x0) {
      if (rValue == (XMLCh *)0x0) goto LAB_00304277;
    }
    else {
      bVar3 = *lValue != L'\0';
      if (rValue == (XMLCh *)0x0 || bVar3) goto LAB_00304279;
    }
LAB_0030426e:
    bVar3 = *rValue != L'\0';
  }
LAB_00304279:
  return -(uint)bVar3;
}

Assistant:

inline bool XMLString::equals(   const XMLCh* str1
                               , const XMLCh* str2)
{
    if (str1 == str2)
        return true;

    if (str1 == 0 || str2 == 0)
        return ((!str1 || !*str1) && (!str2 || !*str2));

    while (*str1)
        if(*str1++ != *str2++)  // they are different (or str2 is shorter and we hit the NULL)
            return false;

    // either both ended (and *str2 is 0 too), or str2 is longer
    return (*str2==0);
}